

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2DataBuilder::setHangulData
          (Normalizer2DataBuilder *this,UMutableCPTrie *norm16Trie)

{
  uint uVar1;
  UMutableCPTrie *pUVar2;
  uint32_t uVar3;
  Range *pRVar4;
  UErrorCode *pUVar5;
  int local_60;
  UChar32 c;
  uint32_t lvt;
  uint32_t lv;
  undefined1 local_48 [8];
  IcuToolErrorCode errorCode;
  UChar32 c_1;
  Range *range;
  UMutableCPTrie *pUStack_18;
  HangulIterator hi;
  UMutableCPTrie *norm16Trie_local;
  Normalizer2DataBuilder *this_local;
  
  pUStack_18 = norm16Trie;
  HangulIterator::HangulIterator((HangulIterator *)((long)&range + 4));
  do {
    pRVar4 = HangulIterator::nextRange((HangulIterator *)((long)&range + 4));
    if (pRVar4 == (Range *)0x0) {
      IcuToolErrorCode::IcuToolErrorCode((IcuToolErrorCode *)local_48,"gennorm2/setHangulData()");
      pUVar2 = pUStack_18;
      if (0x1161 < this->indexes[9]) {
        this->indexes[9] = 0x1161;
      }
      pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_48);
      umutablecptrie_setRange_63(pUVar2,0x1100,0x1112,2,pUVar5);
      pUVar2 = pUStack_18;
      pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_48);
      umutablecptrie_setRange_63(pUVar2,0x1161,0x1175,0xfe00,pUVar5);
      pUVar2 = pUStack_18;
      pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_48);
      umutablecptrie_setRange_63(pUVar2,0x11a8,0x11c2,0xfe00,pUVar5);
      pUVar2 = pUStack_18;
      uVar3 = this->indexes[10];
      uVar1 = this->indexes[0xe];
      if (0xac00 < this->indexes[8]) {
        this->indexes[8] = 0xac00;
      }
      pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_48);
      umutablecptrie_set_63(pUVar2,0xac00,uVar3,pUVar5);
      pUVar2 = pUStack_18;
      pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_48);
      umutablecptrie_setRange_63(pUVar2,0xac01,0xd7a3,uVar1 | 1,pUVar5);
      local_60 = 0xac00;
      while (pUVar2 = pUStack_18, local_60 = local_60 + 0x1c, local_60 < 0xd7a4) {
        pUVar5 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_48);
        umutablecptrie_set_63(pUVar2,local_60,uVar3,pUVar5);
      }
      ErrorCode::assertSuccess((ErrorCode *)local_48);
      IcuToolErrorCode::~IcuToolErrorCode((IcuToolErrorCode *)local_48);
      return;
    }
    for (errorCode.location._4_4_ = pRVar4->start; errorCode.location._4_4_ <= pRVar4->end;
        errorCode.location._4_4_ = errorCode.location._4_4_ + 1) {
      uVar3 = umutablecptrie_get_63(pUStack_18,errorCode.location._4_4_);
      if (1 < uVar3) {
        fprintf(_stderr,
                "gennorm2 error: illegal mapping/composition/ccc data for Hangul or Jamo U+%04lX\n",
                (long)errorCode.location._4_4_);
        exit(3);
      }
    }
  } while( true );
}

Assistant:

void Normalizer2DataBuilder::setHangulData(UMutableCPTrie *norm16Trie) {
    HangulIterator hi;
    const HangulIterator::Range *range;
    // Check that none of the Hangul/Jamo code points have data.
    while((range=hi.nextRange())!=NULL) {
        for(UChar32 c=range->start; c<=range->end; ++c) {
            if(umutablecptrie_get(norm16Trie, c)>Normalizer2Impl::INERT) {
                fprintf(stderr,
                        "gennorm2 error: "
                        "illegal mapping/composition/ccc data for Hangul or Jamo U+%04lX\n",
                        (long)c);
                exit(U_INVALID_FORMAT_ERROR);
            }
        }
    }
    // Set data for algorithmic runtime handling.
    IcuToolErrorCode errorCode("gennorm2/setHangulData()");

    // Jamo V/T are maybeYes
    if(Hangul::JAMO_V_BASE<indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]) {
        indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]=Hangul::JAMO_V_BASE;
    }
    umutablecptrie_setRange(norm16Trie, Hangul::JAMO_L_BASE, Hangul::JAMO_L_END,
                            Normalizer2Impl::JAMO_L, errorCode);
    umutablecptrie_setRange(norm16Trie, Hangul::JAMO_V_BASE, Hangul::JAMO_V_END,
                            Normalizer2Impl::JAMO_VT, errorCode);
    // JAMO_T_BASE+1: not U+11A7
    umutablecptrie_setRange(norm16Trie, Hangul::JAMO_T_BASE+1, Hangul::JAMO_T_END,
                            Normalizer2Impl::JAMO_VT, errorCode);

    // Hangul LV encoded as minYesNo
    uint32_t lv=indexes[Normalizer2Impl::IX_MIN_YES_NO];
    // Hangul LVT encoded as minYesNoMappingsOnly|HAS_COMP_BOUNDARY_AFTER
    uint32_t lvt=indexes[Normalizer2Impl::IX_MIN_YES_NO_MAPPINGS_ONLY]|
        Normalizer2Impl::HAS_COMP_BOUNDARY_AFTER;
    if(Hangul::HANGUL_BASE<indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]) {
        indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]=Hangul::HANGUL_BASE;
    }
    // Set the first LV, then write all other Hangul syllables as LVT,
    // then overwrite the remaining LV.
    umutablecptrie_set(norm16Trie, Hangul::HANGUL_BASE, lv, errorCode);
    umutablecptrie_setRange(norm16Trie, Hangul::HANGUL_BASE+1, Hangul::HANGUL_END, lvt, errorCode);
    UChar32 c=Hangul::HANGUL_BASE;
    while((c+=Hangul::JAMO_T_COUNT)<=Hangul::HANGUL_END) {
        umutablecptrie_set(norm16Trie, c, lv, errorCode);
    }
    errorCode.assertSuccess();
}